

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_buffer.cc
# Opt level: O2

unique_ptr<dtc::input_buffer,_std::default_delete<dtc::input_buffer>_> __thiscall
dtc::input_buffer::buffer_for_file(input_buffer *this,string *path,bool warn)

{
  pointer pcVar1;
  FILE *__stream;
  bool bVar2;
  int iVar3;
  int iVar4;
  _func_int **pp_Var5;
  _func_int *p_Var6;
  int *piVar7;
  char *pcVar8;
  string local_170 [32];
  stat local_150;
  stat st;
  
  bVar2 = std::operator==(path,"-");
  if (bVar2) {
    pp_Var5 = (_func_int **)operator_new(0x30);
    pp_Var5[1] = (_func_int *)0x0;
    pp_Var5[2] = (_func_int *)0x0;
    *pp_Var5 = (_func_int *)&PTR_filename_abi_cxx11__0014fcc8;
    pp_Var5[5] = (_func_int *)0x0;
    pp_Var5[3] = (_func_int *)0x0;
    pp_Var5[4] = (_func_int *)0x0;
    while (iVar3 = fgetc(_stdin), iVar3 != -1) {
      local_150.st_dev._0_1_ = (undefined1)iVar3;
      std::vector<char,_std::allocator<char>_>::emplace_back<char>
                ((vector<char,_std::allocator<char>_> *)(pp_Var5 + 3),(char *)&local_150);
    }
    pp_Var5[1] = pp_Var5[3];
    *(int *)(pp_Var5 + 2) = *(int *)(pp_Var5 + 4) - (int)pp_Var5[3];
    this->_vptr_input_buffer = pp_Var5;
  }
  else {
    iVar3 = open((path->_M_dataplus)._M_p,0);
    __stream = _stderr;
    if (iVar3 == -1) {
      if (warn) {
        pcVar1 = (path->_M_dataplus)._M_p;
        piVar7 = __errno_location();
        pcVar8 = strerror(*piVar7);
        fprintf(__stream,"Unable to open file \'%s\'.  %s\n",pcVar1,pcVar8);
      }
    }
    else {
      iVar4 = fstat(iVar3,(stat *)&st);
      if ((iVar4 != 0) || ((st.st_mode & 0xf000) != 0x4000)) {
        pp_Var5 = (_func_int **)operator_new(0x38);
        std::__cxx11::string::string(local_170,(string *)path);
        pp_Var5[1] = (_func_int *)0x0;
        pp_Var5[2] = (_func_int *)0x0;
        *pp_Var5 = (_func_int *)&PTR_filename_abi_cxx11__0014fd08;
        std::__cxx11::string::string((string *)(pp_Var5 + 3),local_170);
        iVar4 = fstat(iVar3,&local_150);
        if (iVar4 != 0) {
          perror("Failed to stat file");
        }
        *(int *)(pp_Var5 + 2) = (int)local_150.st_size;
        p_Var6 = (_func_int *)mmap((void *)0x0,(long)(int)local_150.st_size,1,2,iVar3,0);
        pp_Var5[1] = p_Var6;
        if (p_Var6 != (_func_int *)0xffffffffffffffff) {
          this->_vptr_input_buffer = pp_Var5;
          std::__cxx11::string::~string(local_170);
          close(iVar3);
          return (__uniq_ptr_data<dtc::input_buffer,_std::default_delete<dtc::input_buffer>,_true,_true>
                  )(__uniq_ptr_data<dtc::input_buffer,_std::default_delete<dtc::input_buffer>,_true,_true>
                    )this;
        }
        perror("Failed to mmap file");
        exit(1);
      }
      if (warn) {
        fprintf(_stderr,"File %s is a directory\n",(path->_M_dataplus)._M_p);
      }
      close(iVar3);
    }
    this->_vptr_input_buffer = (_func_int **)0x0;
  }
  return (__uniq_ptr_data<dtc::input_buffer,_std::default_delete<dtc::input_buffer>,_true,_true>)
         (__uniq_ptr_data<dtc::input_buffer,_std::default_delete<dtc::input_buffer>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<input_buffer>
input_buffer::buffer_for_file(const string &path, bool warn)
{
	if (path == "-")
	{
		std::unique_ptr<input_buffer> b(new stream_input_buffer());
		return b;
	}
	int source = open(path.c_str(), O_RDONLY);
	if (source == -1)
	{
		if (warn)
		{
			fprintf(stderr, "Unable to open file '%s'.  %s\n", path.c_str(), strerror(errno));
		}
		return 0;
	}
	struct stat st;
	if (fstat(source, &st) == 0 && S_ISDIR(st.st_mode))
	{
		if (warn)
		{
			fprintf(stderr, "File %s is a directory\n", path.c_str());
		}
		close(source);
		return 0;
	}
	std::unique_ptr<input_buffer> b(new mmap_input_buffer(source, string(path)));
	close(source);
	return b;
}